

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::lsd_announce(torrent *this)

{
  anon_class_16_2_3fe4823c f;
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  session_settings *this_00;
  info_hash_t *this_01;
  ushort local_32;
  uint local_14;
  torrent *ptStack_10;
  int port;
  torrent *this_local;
  
  if (((((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
       (((byte)this->field_0x5cc >> 6 & 1) != 0)) &&
      ((ptStack_10 = this, ((byte)this->field_0x5c0 >> 3 & 1) != 0 ||
       (bVar1 = valid_metadata(this), !bVar1)))) && (((byte)this->field_0x5c0 >> 1 & 1) != 0)) {
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    bVar1 = torrent_info::is_valid(peVar4);
    if (bVar1) {
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      bVar1 = torrent_info::priv(peVar4);
      if (bVar1) {
        return;
      }
    }
    bVar1 = is_i2p(this);
    if (bVar1) {
      this_00 = settings(this);
      bVar1 = session_settings::get_bool(this_00,0x8017);
      if (!bVar1) {
        return;
      }
    }
    bVar1 = is_paused(this);
    if ((!bVar1) &&
       (uVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x3d])(), (uVar2 & 1) != 0)) {
      bVar1 = is_ssl_torrent(this);
      if (bVar1) {
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x21])();
        local_32 = (ushort)iVar3;
      }
      else {
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x20])();
        local_32 = (ushort)iVar3;
      }
      local_14 = (uint)local_32;
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      this_01 = torrent_info::info_hashes(peVar4);
      f.port = (int *)&local_14;
      f.this = this;
      info_hash_t::for_each<libtorrent::aux::torrent::lsd_announce()::__0>(this_01,f);
    }
  }
  return;
}

Assistant:

void torrent::lsd_announce()
	{
		if (m_abort) return;
		if (!m_enable_lsd) return;

		// if the files haven't been checked yet, we're
		// not ready for peers. Except, if we don't have metadata,
		// we need peers to download from
		if (!m_files_checked && valid_metadata()) return;

		if (!m_announce_to_lsd) return;

		// private torrents are never announced on LSD
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return;

#if TORRENT_USE_I2P
		// i2p torrents are also never announced on LSD
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return;
#endif

		if (is_paused()) return;

		if (!m_ses.has_lsd()) return;

		// TODO: this pattern is repeated in a few places. Factor this into
		// a function and generalize the concept of a torrent having a
		// dedicated listen port
#ifdef TORRENT_SSL_PEERS
		int port = is_ssl_torrent() ? m_ses.ssl_listen_port() : m_ses.listen_port();
#else
		int port = m_ses.listen_port();
#endif

		// announce with the local discovery service
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			m_ses.announce_lsd(ih, port);
		});
	}